

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O3

bool embree::AccelN::pointQuery(Intersectors *This_in,PointQuery *query,PointQueryContext *context)

{
  AccelData *pAVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  
  pAVar1 = This_in->ptr;
  lVar4 = *(long *)&pAVar1[3].type;
  lVar5 = *(long *)&pAVar1[3].field_0x58;
  if (lVar5 == lVar4) {
    bVar6 = 0;
  }
  else {
    uVar7 = 0;
    bVar6 = 0;
    do {
      lVar2 = *(long *)(lVar4 + uVar7 * 8);
      if (*(float *)(lVar2 + 0x10) < INFINITY) {
        bVar3 = (**(code **)(lVar2 + 0x88))(lVar2 + 0x58,query,context);
        bVar6 = bVar6 | bVar3;
        lVar4 = *(long *)&pAVar1[3].type;
        lVar5 = *(long *)&pAVar1[3].field_0x58;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(lVar5 - lVar4 >> 3));
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool AccelN::pointQuery (Accel::Intersectors* This_in, PointQuery* query, PointQueryContext* context)
  {
    bool changed = false;
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++)
      if (!This->accels[i]->isEmpty())
        changed |= This->accels[i]->intersectors.pointQuery(query,context);
    return changed;
  }